

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetParametersTest::TestCustomFramebuffer
          (GetParametersTest *this)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  MessageBuilder *pMVar5;
  long lVar6;
  bool bVar7;
  GLchar **value;
  GLint parameter_dsa;
  GLint parameter_legacy;
  int local_1c8;
  int local_1c4;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  bVar7 = true;
  value = TestCustomFramebuffer::pnames_strings;
  lVar6 = 0;
  do {
    if (lVar6 == 0x2c) {
      return bVar7;
    }
    local_1c4 = 0;
    local_1c8 = 0;
    uVar2 = *(undefined4 *)((long)TestCustomFramebuffer::pnames + lVar6);
    (**(code **)(lVar4 + 0x838))(0x8d40,uVar2,&local_1c4);
    err = (**(code **)(lVar4 + 0x800))();
    glu::checkError(err,"glGetFramebufferParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xf23);
    (**(code **)(lVar4 + 0x918))(this->m_fbo,uVar2,&local_1c8);
    iVar3 = (**(code **)(lVar4 + 0x800))();
    if (iVar3 == 0) {
      if (local_1c4 != local_1c8) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"GetNamedFramebufferParameteriv returned ");
        std::ostream::operator<<(poVar1,local_1c8);
        std::operator<<((ostream *)poVar1,", but ");
        std::ostream::operator<<(poVar1,local_1c4);
        std::operator<<((ostream *)poVar1," was expected for ");
        pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
        std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        " parameter name of framebuffer object.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00b000d3;
      }
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"GetNamedFramebufferParameteriv unexpectedly generated ");
      local_1c0.m_getName = glu::getErrorName;
      local_1c0.m_value = iVar3;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1," error when called with ");
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " parameter name for framebuffer object.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00b000d3:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      bVar7 = false;
    }
    lVar6 = lVar6 + 4;
    value = value + 1;
  } while( true );
}

Assistant:

bool GetParametersTest::TestCustomFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum pnames[] = { GL_DOUBLEBUFFER,
										  GL_IMPLEMENTATION_COLOR_READ_FORMAT,
										  GL_IMPLEMENTATION_COLOR_READ_TYPE,
										  GL_SAMPLES,
										  GL_SAMPLE_BUFFERS,
										  GL_STEREO,
										  GL_FRAMEBUFFER_DEFAULT_WIDTH,
										  GL_FRAMEBUFFER_DEFAULT_HEIGHT,
										  GL_FRAMEBUFFER_DEFAULT_LAYERS,
										  GL_FRAMEBUFFER_DEFAULT_SAMPLES,
										  GL_FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS };

	static const glw::GLchar* pnames_strings[] = { "GL_DOUBLEBUFFER",
												   "GL_IMPLEMENTATION_COLOR_READ_FORMAT",
												   "GL_IMPLEMENTATION_COLOR_READ_TYPE",
												   "GL_SAMPLES",
												   "GL_SAMPLE_BUFFERS",
												   "GL_STEREO",
												   "FRAMEBUFFER_DEFAULT_WIDTH",
												   "FRAMEBUFFER_DEFAULT_HEIGHT",
												   "FRAMEBUFFER_DEFAULT_LAYERS",
												   "FRAMEBUFFER_DEFAULT_SAMPLES",
												   "FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS" };

	glw::GLuint pnames_count = sizeof(pnames) / sizeof(pnames[0]);

	for (glw::GLuint i = 0; i < pnames_count; ++i)
	{
		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		gl.getFramebufferParameteriv(GL_FRAMEBUFFER, pnames[i], &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferParameteriv(m_fbo, pnames[i], &parameter_dsa);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferParameteriv unexpectedly generated "
				<< glu::getErrorStr(error) << " error when called with " << pnames_strings[i]
				<< " parameter name for framebuffer object." << tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetNamedFramebufferParameteriv returned "
												<< parameter_dsa << ", but " << parameter_legacy << " was expected for "
												<< pnames_strings[i] << " parameter name of framebuffer object."
												<< tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}

	return is_ok;
}